

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O2

string * __thiscall
psy::C::SyntaxWriterDOTFormat::terminalId_abi_cxx11_
          (string *__return_storage_ptr__,SyntaxWriterDOTFormat *this,SyntaxToken *tk)

{
  string local_30;
  
  SyntaxToken::valueText_abi_cxx11_(&local_30,tk);
  std::operator+(__return_storage_ptr__,'t',&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SyntaxWriterDOTFormat::terminalId(const SyntaxToken& tk)
{
    return 't' + tk.valueText();
}